

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * __thiscall
pbrt::SpotLight::Bounds(LightBounds *__return_storage_ptr__,SpotLight *this)

{
  float fVar1;
  Float FVar2;
  float fVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Float aFVar9 [4];
  float *__result;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  float fVar13;
  float __x;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [64];
  
  aFVar9 = (this->super_LightBase).renderFromLight.m.m[0];
  fVar14 = (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar1 = this->scale;
  pfVar10 = (this->I).values.ptr;
  uVar5 = (this->I).values.nStored;
  auVar15 = ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]);
  fVar17 = (this->super_LightBase).renderFromLight.m.m[0][3];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[1][0];
  auVar16 = ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]);
  fVar3 = (this->super_LightBase).renderFromLight.m.m[1][3];
  if (1 < uVar5) {
    auVar23 = ZEXT464((uint)*pfVar10);
    lVar11 = uVar5 * 4 + -4;
    pfVar12 = pfVar10;
    do {
      pfVar12 = pfVar12 + 1;
      fVar22 = auVar23._0_4_;
      auVar20 = vmaxss_avx(ZEXT416((uint)*pfVar12),auVar23._0_16_);
      auVar23 = ZEXT1664(auVar20);
      if (fVar22 < *pfVar12) {
        pfVar10 = pfVar12;
      }
      lVar11 = lVar11 + -4;
    } while (lVar11 != 0);
  }
  auVar20 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar21 = ZEXT816(0) << 0x40;
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]),auVar21
                            ,ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)
                                    ));
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]),auVar21,
                           ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0)))
  ;
  fVar22 = fVar14 + auVar19._0_4_;
  auVar18 = vfmadd231ss_fma(auVar19,ZEXT416(0) << 0x20,ZEXT416((uint)fVar14));
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]),auVar21
                            ,auVar8);
  fVar14 = (this->super_LightBase).renderFromLight.m.m[2][3] + auVar18._0_4_;
  fVar7 = (this->super_LightBase).renderFromLight.m.m[3][3] + auVar19._0_4_;
  bVar6 = fVar7 == 1.0;
  fVar13 = (float)((uint)bVar6 * (int)fVar14 + (uint)!bVar6 * (int)(fVar14 / fVar7));
  fVar14 = *pfVar10;
  __x = acosf(this->cosFalloffEnd);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
  auVar19 = vinsertps_avx((undefined1  [16])aFVar9,ZEXT416((uint)FVar2),0x10);
  auVar8._4_4_ = auVar20._4_4_ * 0.0;
  auVar8._0_4_ = auVar20._0_4_ * 0.0;
  auVar8._8_4_ = auVar20._8_4_ * 0.0;
  auVar8._12_4_ = auVar20._12_4_ * 0.0;
  auVar19 = vfmadd213ps_fma(auVar19,ZEXT816(0) << 0x40,auVar8);
  auVar20 = vinsertps_avx(auVar15,auVar16,0x10);
  auVar18._0_4_ = auVar20._0_4_ + auVar19._0_4_;
  auVar18._4_4_ = auVar20._4_4_ + auVar19._4_4_;
  auVar18._8_4_ = auVar20._8_4_ + auVar19._8_4_;
  auVar18._12_4_ = auVar20._12_4_ + auVar19._12_4_;
  auVar20 = vfmadd213ss_fma(auVar15,ZEXT816(0) << 0x40,auVar19);
  auVar15 = vmovshdup_avx(auVar19);
  auVar15 = vfmadd231ss_fma(auVar15,auVar16,ZEXT816(0) << 0x40);
  fVar3 = auVar15._0_4_ + fVar3;
  auVar15._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar15._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar15._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar15._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar15 = vmovshdup_avx(auVar15);
  auVar15 = vfmadd231ss_fma(auVar15,auVar18,auVar18);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  auVar19._0_4_ = auVar15._0_4_;
  auVar21._0_4_ = fVar22 / auVar19._0_4_;
  auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar15 = vdivps_avx(auVar18,auVar19);
  fVar17 = auVar20._0_4_ + fVar17;
  auVar16 = vinsertps_avx(ZEXT416((uint)bVar6 * (int)fVar17 + (uint)!bVar6 * (int)(fVar17 / fVar7)),
                          ZEXT416((uint)bVar6 * (int)fVar3 + (uint)!bVar6 * (int)(fVar3 / fVar7)),
                          0x10);
  uVar4 = vmovlps_avx(auVar16);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar4 >> 0x20);
  uVar4 = vmovlps_avx(auVar16);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar4 >> 0x20);
  auVar16._0_4_ = auVar15._0_4_ * auVar15._0_4_;
  auVar16._4_4_ = auVar15._4_4_ * auVar15._4_4_;
  auVar16._8_4_ = auVar15._8_4_ * auVar15._8_4_;
  auVar16._12_4_ = auVar15._12_4_ * auVar15._12_4_;
  auVar16 = vmovshdup_avx(auVar16);
  auVar16 = vfmadd231ss_fma(auVar16,auVar15,auVar15);
  auVar16 = vfmadd231ss_fma(auVar16,auVar21,auVar21);
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar17 = auVar16._0_4_;
  auVar20._4_4_ = fVar17;
  auVar20._0_4_ = fVar17;
  auVar20._8_4_ = fVar17;
  auVar20._12_4_ = fVar17;
  auVar15 = vdivps_avx(auVar15,auVar20);
  uVar4 = vmovlps_avx(auVar15);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar4 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_ / fVar17;
  __return_storage_ptr__->phi = fVar1 * fVar14 * 4.0 * 3.1415927;
  __return_storage_ptr__->theta_o = 0.0;
  __return_storage_ptr__->theta_e = __x;
  __return_storage_ptr__->cosTheta_o = 1.0;
  fVar14 = cosf(__x);
  __return_storage_ptr__->cosTheta_e = fVar14;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    // As in Phi()
#if 0
    Float phi = scale * I.MaxValue() * 2 * Pi * ((1 - cosFalloffStart) +
                                          (cosFalloffStart - cosFalloffEnd) / 2);
#else
    // cf. room-subsurf-from-kd.pbrt test: we sorta kinda actually want to
    // compute power as if it was an isotropic light source; the
    // LightBounds geometric terms give zero importance outside the spot
    // light's cone, so inside the cone, it doesn't matter if the overall
    // power is low; it's more accurate to effectively treat it as a point
    // light source.
    Float phi = scale * I.MaxValue() * 4 * Pi;
#endif

    return LightBounds(p, w, phi, 0.f, std::acos(cosFalloffEnd), false);
}